

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O0

int ebur128_loudness_window(ebur128_state *st,unsigned_long window,double *out)

{
  double dVar1;
  int error;
  size_t interval_frames;
  double energy;
  double *out_local;
  unsigned_long window_local;
  ebur128_state *st_local;
  
  if (st->d->window < window) {
    st_local._4_4_ = 2;
  }
  else {
    energy = (double)out;
    out_local = (double *)window;
    window_local = (unsigned_long)st;
    st_local._4_4_ =
         ebur128_energy_in_interval(st,(st->samplerate * window) / 1000,(double *)&interval_frames);
    if (st_local._4_4_ == 0) {
      if (0.0 < (double)interval_frames) {
        dVar1 = ebur128_energy_to_loudness((double)interval_frames);
        *(double *)energy = dVar1;
        st_local._4_4_ = 0;
      }
      else {
        *(undefined8 *)energy = 0xfff0000000000000;
        st_local._4_4_ = 0;
      }
    }
  }
  return st_local._4_4_;
}

Assistant:

int ebur128_loudness_window(ebur128_state* st,
                            unsigned long window,
                            double* out) {
  double energy;
  size_t interval_frames;
  int error;

  if (window > st->d->window) {
    return EBUR128_ERROR_INVALID_MODE;
  }

  interval_frames = st->samplerate * window / 1000;
  error = ebur128_energy_in_interval(st, interval_frames, &energy);
  if (error) {
    return error;
  }

  if (energy <= 0.0) {
    *out = -HUGE_VAL;
    return EBUR128_SUCCESS;
  }

  *out = ebur128_energy_to_loudness(energy);
  return EBUR128_SUCCESS;
}